

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::EnforceDirectoryLevelRules(cmMakefile *this)

{
  PolicyStatus PVar1;
  ostream *poVar2;
  string sStack_1a8;
  ostringstream msg;
  
  if (this->CheckCMP0000 == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar2 = std::operator<<((ostream *)&msg,"No cmake_minimum_required command is present.  ");
    poVar2 = std::operator<<(poVar2,"A line of code such as\n");
    poVar2 = std::operator<<(poVar2,"  cmake_minimum_required(VERSION ");
    cmVersion::GetMajorVersion();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,".");
    cmVersion::GetMinorVersion();
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,")\n");
    poVar2 = std::operator<<(poVar2,"should be added at the top of the file.  ");
    poVar2 = std::operator<<(poVar2,"The version specified may be lower if you wish to ");
    poVar2 = std::operator<<(poVar2,"support older CMake versions for this project.  ");
    poVar2 = std::operator<<(poVar2,"For more information run ");
    std::operator<<(poVar2,"\"cmake --help-policy CMP0000\".");
    PVar1 = GetPolicyStatus(this,CMP0000);
    if (PVar1 - NEW < 3) {
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&sStack_1a8);
      std::__cxx11::string::~string((string *)&sStack_1a8);
      cmSystemTools::s_FatalErrorOccured = true;
    }
    else if (PVar1 == WARN) {
      std::__cxx11::stringbuf::str();
      IssueMessage(this,AUTHOR_WARNING,&sStack_1a8);
      std::__cxx11::string::~string((string *)&sStack_1a8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  }
  return;
}

Assistant:

void cmMakefile::EnforceDirectoryLevelRules() const
{
  // Diagnose a violation of CMP0000 if necessary.
  if(this->CheckCMP0000)
    {
    std::ostringstream msg;
    msg << "No cmake_minimum_required command is present.  "
        << "A line of code such as\n"
        << "  cmake_minimum_required(VERSION "
        << cmVersion::GetMajorVersion() << "."
        << cmVersion::GetMinorVersion()
        << ")\n"
        << "should be added at the top of the file.  "
        << "The version specified may be lower if you wish to "
        << "support older CMake versions for this project.  "
        << "For more information run "
        << "\"cmake --help-policy CMP0000\".";
    switch (this->GetPolicyStatus(cmPolicies::CMP0000))
      {
      case cmPolicies::WARN:
        // Warn because the user did not provide a mimimum required
        // version.
        this->IssueMessage(cmake::AUTHOR_WARNING, msg.str());
      case cmPolicies::OLD:
        // OLD behavior is to use policy version 2.4 set in
        // cmListFileCache.
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        // NEW behavior is to issue an error.
        this->IssueMessage(cmake::FATAL_ERROR, msg.str());
        cmSystemTools::SetFatalErrorOccured();
        return;
      }
    }
}